

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestMultiProcessHandler::AllocateResources(cmCTestMultiProcessHandler *this,int index)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  mapped_type *ppcVar5;
  mapped_type *this_00;
  _Base_ptr p_Var6;
  _Base_ptr *id;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
  allocations;
  int local_9c;
  _Rb_tree_node_base *local_98;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
  *local_90;
  ResourceAllocation local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
  local_60;
  
  bVar3 = true;
  if (this->TestHandler->UseResourceSpec == true) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_9c = index;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar3 = TryAllocateResources
                      (this,index,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
                        *)&local_60,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>
                        *)0x0);
    if (bVar3) {
      local_90 = std::map<$a129e267$>::operator[](&this->AllocatedResources,&local_9c);
      ppcVar5 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_9c);
      std::
      vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
      ::resize(local_90,((long)((*ppcVar5)->ResourceGroups).
                               super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)((*ppcVar5)->ResourceGroups).
                               super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
              );
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header) {
        p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          p_Var1 = *(_Base_ptr *)(p_Var6 + 2);
          p_Var2 = p_Var6[2]._M_parent;
          local_98 = p_Var6;
          if (p_Var1 != p_Var2) {
            do {
              id = &p_Var1->_M_left;
              bVar4 = cmCTestResourceAllocator::AllocateResource
                                (&this->ResourceAllocator,(string *)(p_Var6 + 1),(string *)id,
                                 *(uint *)(id + -1));
              if (!bVar4) {
                __assert_fail("result",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                              ,0x10f,"bool cmCTestMultiProcessHandler::AllocateResources(int)");
              }
              this_00 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>
                        ::operator[]((local_90->
                                     super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + *(long *)(id + -2)
                                     ,(key_type *)(p_Var6 + 1));
              local_88.Id._M_dataplus._M_p = (pointer)&local_88.Id.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_88,*id,(long)&id[1]->_M_color + (long)&(*id)->_M_color);
              local_88.Slots = *(uint *)(id + -1);
              std::
              vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>
              ::emplace_back<cmCTestMultiProcessHandler::ResourceAllocation>(this_00,&local_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88.Id._M_dataplus._M_p != &local_88.Id.field_2) {
                operator_delete(local_88.Id._M_dataplus._M_p,
                                local_88.Id.field_2._M_allocated_capacity + 1);
              }
              p_Var1 = (_Base_ptr)(id + 4);
            } while ((_Base_ptr)(id + 4) != p_Var2);
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_98);
        } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestBinPackerAllocation,_std::allocator<cmCTestBinPackerAllocation>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return bVar3;
}

Assistant:

bool cmCTestMultiProcessHandler::AllocateResources(int index)
{
  if (!this->TestHandler->UseResourceSpec) {
    return true;
  }

  std::map<std::string, std::vector<cmCTestBinPackerAllocation>> allocations;
  if (!this->TryAllocateResources(index, allocations)) {
    return false;
  }

  auto& allocatedResources = this->AllocatedResources[index];
  allocatedResources.resize(this->Properties[index]->ResourceGroups.size());
  for (auto const& it : allocations) {
    for (auto const& alloc : it.second) {
      bool result = this->ResourceAllocator.AllocateResource(
        it.first, alloc.Id, alloc.SlotsNeeded);
      (void)result;
      assert(result);
      allocatedResources[alloc.ProcessIndex][it.first].push_back(
        { alloc.Id, static_cast<unsigned int>(alloc.SlotsNeeded) });
    }
  }

  return true;
}